

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::NumberFormat::format
          (NumberFormat *this,Formattable *obj,UnicodeString *appendTo,FieldPosition *pos,
          UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  Type TVar4;
  undefined4 extraout_var;
  UnicodeString *pUVar6;
  ArgExtractor arg;
  ArgExtractor local_48;
  long *plVar5;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    ArgExtractor::ArgExtractor(&local_48,(NumberFormat *)obj,obj,(UErrorCode *)pos);
    if (local_48.fWasCurrency != '\0') {
      iVar2 = u_strcmp_63(local_48.save,this->fCurrency);
      if (iVar2 != 0) {
        iVar3 = (*(this->super_Format).super_UObject._vptr_UObject[4])(this);
        plVar5 = (long *)CONCAT44(extraout_var,iVar3);
        (**(code **)(*plVar5 + 0xf8))(plVar5,local_48.save,status);
        pUVar6 = (UnicodeString *)
                 (**(code **)(*plVar5 + 0x28))(plVar5,local_48.num,appendTo,pos,status);
        (**(code **)(*plVar5 + 8))(plVar5);
        return pUVar6;
      }
    }
    UVar1 = Formattable::isNumeric(local_48.num);
    if ((UVar1 == '\0') || ((local_48.num)->fDecimalQuantity == (DecimalQuantity *)0x0)) {
      TVar4 = Formattable::getType(local_48.num);
      if (TVar4 == kInt64) {
        (*(this->super_Format).super_UObject._vptr_UObject[0xf])
                  (this,((local_48.num)->fValue).fObject,appendTo,pos,status);
      }
      else if (TVar4 == kLong) {
        (*(this->super_Format).super_UObject._vptr_UObject[0xc])
                  (this,(ulong)*(uint *)&(local_48.num)->fValue,appendTo,pos,status);
      }
      else if (TVar4 == kDouble) {
        (*(this->super_Format).super_UObject._vptr_UObject[9])
                  (((local_48.num)->fValue).fObject,this,appendTo,pos,status);
      }
      else {
        *status = U_INVALID_FORMAT_ERROR;
      }
    }
    else {
      (*(this->super_Format).super_UObject._vptr_UObject[0x13])
                (this,(local_48.num)->fDecimalQuantity,appendTo,pos,status);
    }
  }
  return appendTo;
}

Assistant:

UnicodeString&
NumberFormat::format(const Formattable& obj,
                        UnicodeString& appendTo,
                        FieldPosition& pos,
                        UErrorCode& status) const
{
    if (U_FAILURE(status)) return appendTo;

    ArgExtractor arg(*this, obj, status);
    const Formattable *n = arg.number();
    const UChar *iso = arg.iso();

    if(arg.wasCurrency() && u_strcmp(iso, getCurrency())) {
      // trying to format a different currency.
      // Right now, we clone.
      LocalPointer<NumberFormat> cloneFmt((NumberFormat*)this->clone());
      cloneFmt->setCurrency(iso, status);
      // next line should NOT recurse, because n is numeric whereas obj was a wrapper around currency amount.
      return cloneFmt->format(*n, appendTo, pos, status);
    }

    if (n->isNumeric() && n->getDecimalQuantity() != NULL) {
        // Decimal Number.  We will have a DigitList available if the value was
        //   set to a decimal number, or if the value originated with a parse.
        //
        // The default implementation for formatting a DigitList converts it
        // to a double, and formats that, allowing formatting classes that don't
        // know about DigitList to continue to operate as they had.
        //
        // DecimalFormat overrides the DigitList formatting functions.
        format(*n->getDecimalQuantity(), appendTo, pos, status);
    } else {
        switch (n->getType()) {
        case Formattable::kDouble:
            format(n->getDouble(), appendTo, pos, status);
            break;
        case Formattable::kLong:
            format(n->getLong(), appendTo, pos, status);
            break;
        case Formattable::kInt64:
            format(n->getInt64(), appendTo, pos, status);
            break;
        default:
            status = U_INVALID_FORMAT_ERROR;
            break;
        }
    }

    return appendTo;
}